

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O0

void __thiscall
Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_void>::timer_counter
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_void> *this)

{
  bool bVar1;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_void> *this_local;
  
  lock._8_8_ = this;
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->m_running);
    if (!bVar1) break;
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_20,&this->m_cycle_mutex);
    std::condition_variable::wait_for<long,std::ratio<1l,1l>>
              (&this->m_cond_cycle,(unique_lock<std::mutex> *)local_20,&this->m_cycle_time);
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->m_got_stopped);
    if (!bVar1) {
      std::function<void_()>::operator()(&this->m_callable);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  }
  return;
}

Assistant:

void timer_counter() {

    while (m_running) {
      std::unique_lock lock(m_cycle_mutex);
      m_cond_cycle.wait_for(lock, m_cycle_time);
      if (!m_got_stopped){
        m_callable();
      }
    }
  }